

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fctkern__log_test_start(fctkern_t *nk,fct_test_t *test)

{
  size_t sVar1;
  fct_logger_i *logger_00;
  fct_logger_i *logger;
  size_t num_itemslogger;
  size_t item_ilogger;
  fct_test_t *test_local;
  fctkern_t *nk_local;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x967
                  ,"void fctkern__log_test_start(fctkern_t *, const fct_test_t *)");
  }
  if (test == (fct_test_t *)0x0) {
    __assert_fail("test != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x968
                  ,"void fctkern__log_test_start(fctkern_t *, const fct_test_t *)");
  }
  if (nk != (fctkern_t *)0xfffffffffffffe68) {
    sVar1 = fct_nlist__size(&nk->logger_list);
    for (num_itemslogger = 0; num_itemslogger != sVar1; num_itemslogger = num_itemslogger + 1) {
      logger_00 = (fct_logger_i *)fct_nlist__at(&nk->logger_list,num_itemslogger);
      fct_logger__on_test_start(logger_00,test);
    }
  }
  return;
}

Assistant:

static void
fctkern__log_test_start(fctkern_t *nk, fct_test_t const *test)
{
    FCT_ASSERT( nk != NULL );
    FCT_ASSERT( test != NULL );
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_test_start(logger, test);
    }
    FCT_NLIST_FOREACH_END();
}